

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O0

void mgr_print(chmgr *chmgr,char *fmt,...)

{
  char in_AL;
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_4f8 [16];
  undefined8 local_4e8;
  undefined8 local_4e0;
  undefined8 local_4d8;
  undefined8 local_4d0;
  undefined8 local_4c8;
  undefined8 local_4b8;
  undefined8 local_4a8;
  undefined8 local_498;
  undefined8 local_488;
  undefined8 local_478;
  undefined8 local_468;
  undefined8 local_458;
  undefined4 local_448;
  undefined4 local_444;
  va_list ap;
  char local_428 [8];
  char buf [1024];
  int n;
  char *fmt_local;
  chmgr *chmgr_local;
  
  if (in_AL != '\0') {
    local_4c8 = in_XMM0_Qa;
    local_4b8 = in_XMM1_Qa;
    local_4a8 = in_XMM2_Qa;
    local_498 = in_XMM3_Qa;
    local_488 = in_XMM4_Qa;
    local_478 = in_XMM5_Qa;
    local_468 = in_XMM6_Qa;
    local_458 = in_XMM7_Qa;
  }
  ap[0].overflow_arg_area = local_4f8;
  ap[0]._0_8_ = &stack0x00000008;
  local_444 = 0x30;
  local_448 = 0x10;
  local_4e8 = in_RDX;
  local_4e0 = in_RCX;
  local_4d8 = in_R8;
  local_4d0 = in_R9;
  iVar1 = vsnprintf(local_428,0x400,fmt,&local_448);
  write(chmgr->fds[0].fd,local_428,(long)iVar1);
  return;
}

Assistant:

void mgr_print(struct chmgr *chmgr, const char *fmt, ...)
{
    int n;
    char buf[1024];
    va_list ap;
    va_start(ap, fmt);
    n = vsnprintf(buf, 1024, fmt, ap);
    write(chmgr->fds[CTRL_MGR].fd, buf, n);
    va_end(ap);
}